

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matte.cpp
# Opt level: O0

RGBColor __thiscall pm::Matte::areaLightShade(Matte *this,ShadeRecord *sr)

{
  bool bVar1;
  byte bVar2;
  Light *pLVar3;
  vector<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
  *pvVar4;
  size_type sVar5;
  const_reference this_00;
  undefined8 in_RDX;
  ulong extraout_XMM0_Qa;
  ulong uVar6;
  ulong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  float fVar7;
  RGBColor RVar8;
  undefined1 local_d4 [12];
  undefined1 local_c8 [24];
  RGBColor local_b0;
  RGBColor local_a4;
  RGBColor local_98;
  undefined1 local_8c [8];
  Ray shadowRay;
  undefined1 local_6c [3];
  bool inShadow;
  float nDotWi;
  Vector3 wi;
  Light *light;
  uint i;
  size_t numLights;
  undefined1 local_38 [20];
  Vector3 wo;
  ShadeRecord *sr_local;
  Matte *this_local;
  RGBColor *L;
  
  wo._4_8_ = in_RDX;
  Vector3::operator-((Vector3 *)(local_38 + 0xc));
  Lambertian::rho((Lambertian *)local_38,(ShadeRecord *)&sr->hitPoint,(Vector3 *)wo._4_8_);
  pLVar3 = World::ambientLight(*(World **)(wo._4_8_ + 0x60));
  (*pLVar3->_vptr_Light[3])((long)&numLights + 4,pLVar3,wo._4_8_);
  RVar8 = RGBColor::operator*((RGBColor *)this,(RGBColor *)local_38);
  fVar7 = RVar8.b;
  pvVar4 = World::lights(*(World **)(wo._4_8_ + 0x60));
  sVar5 = std::
          vector<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
          ::size(pvVar4);
  uVar6 = extraout_XMM0_Qa;
  for (light._4_4_ = 0; light._4_4_ < sVar5; light._4_4_ = light._4_4_ + 1) {
    pvVar4 = World::lights(*(World **)(wo._4_8_ + 0x60));
    this_00 = std::
              vector<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
              ::operator[](pvVar4,(ulong)light._4_4_);
    wi._4_8_ = std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>::operator*(this_00);
    (*((type)wi._4_8_)->_vptr_Light[2])(local_6c,wi._4_8_,wo._4_8_);
    shadowRay.d.z = dot((Vector3 *)(wo._4_8_ + 0x28),(Vector3 *)local_6c);
    uVar6 = (ulong)(uint)shadowRay.d.z;
    fVar7 = 0.0;
    if (0.0 < shadowRay.d.z) {
      shadowRay.d.y._3_1_ = 0;
      bVar1 = Light::castShadows((Light *)wi._4_8_);
      uVar6 = extraout_XMM0_Qa_00;
      if (bVar1) {
        Ray::Ray((Ray *)local_8c,(Vector3 *)(wo._4_8_ + 0x10),(Vector3 *)local_6c);
        bVar2 = (**(code **)(*(long *)wi._4_8_ + 0x20))(wi._4_8_,local_8c,wo._4_8_);
        shadowRay.d.y._3_1_ = bVar2 & 1;
        uVar6 = extraout_XMM0_Qa_01;
      }
      if ((shadowRay.d.y._3_1_ & 1) == 0) {
        RVar8 = Lambertian::f((Lambertian *)local_c8,(ShadeRecord *)&(sr->ray).d,(Vector3 *)wo._4_8_
                              ,(Vector3 *)(local_38 + 0xc));
        (**(code **)(*(long *)wi._4_8_ + 0x18))(RVar8._0_8_,RVar8.b,local_d4,wi._4_8_,wo._4_8_);
        RVar8 = RGBColor::operator*((RGBColor *)(local_c8 + 0xc),(RGBColor *)local_c8);
        fVar7 = (float)(**(code **)(*(long *)wi._4_8_ + 0x28))
                                 (RVar8._0_8_,RVar8.b,wi._4_8_,wo._4_8_);
        RGBColor::operator*(&local_b0,fVar7);
        RVar8 = RGBColor::operator*(&local_a4,shadowRay.d.z);
        fVar7 = (float)(**(code **)(*(long *)wi._4_8_ + 0x30))
                                 (RVar8._0_8_,RVar8.b,wi._4_8_,wo._4_8_);
        RVar8 = RGBColor::operator/(&local_98,fVar7);
        fVar7 = RVar8.b;
        RGBColor::operator+=((RGBColor *)this,&local_98);
        uVar6 = extraout_XMM0_Qa_02;
      }
    }
  }
  RVar8.b = fVar7;
  RVar8.r = (float)(int)uVar6;
  RVar8.g = (float)(int)(uVar6 >> 0x20);
  return RVar8;
}

Assistant:

RGBColor Matte::areaLightShade(ShadeRecord &sr) const
{
	const Vector3 wo = -sr.ray.d;
	RGBColor L = ambientBrdf_.rho(sr, wo) * sr.world.ambientLight().L(sr);
	const size_t numLights = sr.world.lights().size();

	for (unsigned int i = 0; i < numLights; i++)
	{
		const Light &light = *sr.world.lights()[i];
		const Vector3 wi = light.direction(sr);
		const float nDotWi = dot(sr.normal, wi);

		if (nDotWi > 0.0f)
		{
			bool inShadow = false;

			if (light.castShadows())
			{
				Ray shadowRay(sr.hitPoint, wi);
				inShadow = light.inShadow(shadowRay, sr);
			}

			if (inShadow == false)
				L += diffuseBrdf_.f(sr, wo, wi) * light.L(sr) * light.G(sr) * nDotWi / light.pdf(sr);
		}
	}

	return L;
}